

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::GetProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  long lVar9;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar10;
  undefined1 local_50 [8];
  CharacterBuffer<char16_t> propertyName;
  
  propertyName._8_8_ = info;
  pcVar5 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  bVar3 = PropertyRecord::IsPropertyNameNumeric(pcVar5,cVar4);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x217,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pcVar5 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
            ((WriteBarrierPtr<const_char16_t> *)local_50,pcVar5);
  paVar10 = &this->descriptors[0].field_1;
  lVar9 = 0;
  propertyName.string.ptr._0_4_ = cVar4;
  do {
    if (this->propertyCount <= lVar9) {
LAB_00cbeb41:
      pRVar8 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar8;
      return 0;
    }
    bVar3 = PropertyRecord::Equals
                      ((((Type *)(paVar10 + -1))->Id).ptr,(CharacterBuffer<char16_t> *)local_50);
    if (bVar3) {
      if ((paVar10->Attributes & 8) == 0) {
        pvVar7 = DynamicObject::GetSlot(instance,(int)lVar9);
        *value = pvVar7;
        if (propertyName._8_8_ == 0) {
          return 1;
        }
        bVar1 = paVar10->Attributes;
        *(DynamicObject **)propertyName._8_8_ = instance;
        *(short *)(propertyName._8_8_ + 8) = (short)lVar9;
        *(byte *)(propertyName._8_8_ + 10) = bVar1;
        *(undefined1 *)(propertyName._8_8_ + 0xb) = 0;
        return 1;
      }
      goto LAB_00cbeb41;
    }
    lVar9 = lVar9 + 1;
    paVar10 = paVar10 + 2;
  } while( true );
}

Assistant:

BOOL SimpleTypeHandler<size>::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->Equals(propertyName))
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    *value = requestContext->GetMissingPropertyResult();
                    return false;
                }
                *value = instance->GetSlot(i);
                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                return true;
            }
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }